

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HApp.cpp
# Opt level: O0

int solveMulti(char *filename,char *partitionfile)

{
  char *in_RSI;
  HDual solver;
  int RtCd;
  HModel model;
  HModel *in_stack_fffffffffffea330;
  HDual *in_stack_fffffffffffea390;
  undefined4 local_11a8 [4];
  undefined4 local_1198;
  string local_1158 [4416];
  char *local_18;
  int local_4;
  
  local_18 = in_RSI;
  HModel::HModel((HModel *)local_11a8);
  local_11a8[0] = 1;
  local_1198 = 1;
  if (local_18 != (char *)0x0) {
    std::__cxx11::string::operator=(local_1158,local_18);
  }
  local_4 = HModel::load_fromMPS((char *)local_11a8);
  if (local_4 == 0) {
    HModel::scaleModel();
    HDual::HDual(in_stack_fffffffffffea390);
    HDual::solve((HModel *)&stack0xfffffffffffea330,(int)local_11a8,2);
    HModel::util_reportSolverOutcome((char *)local_11a8);
    HModel::writePivots((char *)local_11a8);
    local_4 = 0;
    HDual::~HDual(in_stack_fffffffffffea390);
  }
  HModel::~HModel(in_stack_fffffffffffea330);
  return local_4;
}

Assistant:

int solveMulti(const char *filename, const char *partitionfile) {
    HModel model;
    model.intOption[INTOPT_PRINT_FLAG] = 1;
    model.intOption[INTOPT_PERMUTE_FLAG] = 1;
    if (partitionfile) {
        model.strOption[STROPT_PARTITION_FILE] = partitionfile;
    }
    int RtCd = model.load_fromMPS(filename);
    if (RtCd) return RtCd;

    model.scaleModel();
    HDual solver;
    solver.solve(&model, HDUAL_VARIANT_MULTI, 8);

    model.util_reportSolverOutcome("Solve multi");
#ifdef JAJH_dev
    model.writePivots("multi");
#endif
    return 0;
}